

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O0

void __thiscall
KillGameCommand::trigger
          (KillGameCommand *this,Server *source,PlayerInfo *player,string_view parameters)

{
  PlayerInfo *pPVar1;
  PlayerInfo *pPVar2;
  bool bVar3;
  basic_string_view<char,_std::char_traits<char>_> *args_2;
  basic_string_view<char,_std::char_traits<char>_> bVar4;
  size_t local_e8;
  char *local_e0;
  size_t local_d8;
  char *local_d0;
  basic_string_view<char,_std::char_traits<char>_> local_b8;
  string_view local_a8;
  basic_string_view<char,_std::char_traits<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  __sv_type local_68;
  basic_string_view<char,_std::char_traits<char>_> local_58;
  KillGameCommand *local_48;
  size_t local_40;
  long local_38;
  PlayerInfo *target;
  PlayerInfo *player_local;
  Server *source_local;
  KillGameCommand *this_local;
  string_view parameters_local;
  
  args_2 = (basic_string_view<char,_std::char_traits<char>_> *)parameters._M_str;
  this_local = (KillGameCommand *)parameters._M_len;
  target = player;
  player_local = (PlayerInfo *)source;
  source_local = (Server *)this;
  parameters_local._M_len = (size_t)args_2;
  bVar3 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  pPVar2 = player_local;
  pPVar1 = target;
  if (bVar3) {
    bVar4 = sv("Error: Too few parameters. Syntax: kill <player>",0x30);
    local_e8 = bVar4._M_len;
    local_e0 = bVar4._M_str;
    RenX::Server::sendMessage(pPVar2,pPVar1,local_e8,local_e0);
  }
  else {
    local_48 = this_local;
    local_40 = parameters_local._M_len;
    local_38 = RenX::Server::getPlayerByPartName(player_local,this_local,parameters_local._M_len);
    pPVar2 = player_local;
    pPVar1 = target;
    if (local_38 == 0) {
      local_58 = sv("Error: Player not found.",0x18);
      RenX::Server::sendMessage(pPVar2,pPVar1,local_58._M_len,local_58._M_str);
    }
    else if (*(int *)(local_38 + 0x1b0) < target->access) {
      RenX::Server::kill(player_local);
      pPVar2 = player_local;
      pPVar1 = target;
      bVar4 = sv("Player has been killed.",0x17);
      local_d8 = bVar4._M_len;
      local_d0 = bVar4._M_str;
      RenX::Server::sendMessage(pPVar2,pPVar1,local_d8,local_d0);
    }
    else {
      local_98 = sv("Error: You can not kill higher level ",0x25);
      local_a8 = RenX_CommandsPlugin::getStaffTitle(&pluginInstance);
      local_b8 = sv("s.",2);
      jessilib::
      join<std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
                (&local_88,(jessilib *)&local_98,&local_a8,&local_b8,args_2);
      local_68 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_88);
      RenX::Server::sendMessage(pPVar2,pPVar1,local_68._M_len,local_68._M_str);
      std::__cxx11::string::~string((string *)&local_88);
    }
  }
  return;
}

Assistant:

void KillGameCommand::trigger(RenX::Server *source, RenX::PlayerInfo *player, std::string_view parameters) {
	if (!parameters.empty()) {
		RenX::PlayerInfo *target = source->getPlayerByPartName(parameters);
		if (target == nullptr) {
			source->sendMessage(*player, "Error: Player not found."sv);
		}
		else if (target->access >= player->access) {
			source->sendMessage(*player, jessilib::join<std::string>("Error: You can not kill higher level "sv, pluginInstance.getStaffTitle(), "s."sv));
		}
		else {
			source->kill(*target);
			source->sendMessage(*player, "Player has been killed."sv);
		}
	}
	else
		source->sendMessage(*player, "Error: Too few parameters. Syntax: kill <player>"sv);
}